

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetEyeTrackerGlobalPosition
          (VClient *this,uint i_EyeTrackerID,double (*o_rThreeVector) [3],bool *o_rbOccludedFlag)

{
  UInt32 UVar1;
  UInt32 UVar2;
  bool bVar3;
  VEyeTrackerInfo *pVVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  iterator __result;
  iterator pvVar9;
  const_pointer i_Translation;
  array<double,_3UL> local_140;
  undefined1 local_128 [8];
  array<double,_3UL> WorldEyeTranslation;
  array<double,_3UL> EyeTranslation;
  array<double,_3UL> WorldTranslation;
  array<double,_9UL> WorldRotation;
  VGlobalSegments_Segment *rSegment;
  uint j;
  VGlobalSegments *rSegments;
  uint i_1;
  uint SegmentID;
  uint SubjectID;
  VEyeTrackerInfo *rEyeTracker;
  size_t i;
  size_t EyeTrackerIndex;
  Enum local_44;
  undefined1 local_40 [4];
  Enum GetResult;
  scoped_lock Lock;
  bool *o_rbOccludedFlag_local;
  double (*o_rThreeVector_local) [3];
  uint i_EyeTrackerID_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rbOccludedFlag;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40,&this->m_FrameMutex);
  local_44 = Success;
  bVar3 = InitGet<double[3],bool>(this,&local_44,o_rThreeVector,(bool *)Lock._8_8_);
  if (bVar3) {
    i = 0xffffffffffffffff;
    for (rEyeTracker = (VEyeTrackerInfo *)0x0;
        pVVar4 = (VEyeTrackerInfo *)
                 std::
                 vector<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                 ::size(&(this->m_LatestFrame).m_EyeTrackers), rEyeTracker < pVVar4;
        rEyeTracker = (VEyeTrackerInfo *)((long)&(rEyeTracker->super_VItem)._vptr_VItem + 1)) {
      pvVar5 = std::
               vector<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
               ::operator[](&(this->m_LatestFrame).m_EyeTrackers,(size_type)rEyeTracker);
      if (pvVar5->m_DeviceID == i_EyeTrackerID) {
        i = (size_t)rEyeTracker;
      }
    }
    if (i == 0xffffffffffffffff) {
      this_local._4_4_ = InvalidIndex;
    }
    else {
      pvVar5 = std::
               vector<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
               ::operator[](&(this->m_LatestFrame).m_EyeTrackers,i);
      UVar1 = pvVar5->m_SubjectID;
      UVar2 = pvVar5->m_SegmentID;
      for (rSegments._4_4_ = 0;
          sVar6 = std::
                  vector<ViconCGStream::VGlobalSegments,_std::allocator<ViconCGStream::VGlobalSegments>_>
                  ::size(&(this->m_LatestFrame).m_GlobalSegments), rSegments._4_4_ < sVar6;
          rSegments._4_4_ = rSegments._4_4_ + 1) {
        pvVar7 = std::
                 vector<ViconCGStream::VGlobalSegments,_std::allocator<ViconCGStream::VGlobalSegments>_>
                 ::operator[](&(this->m_LatestFrame).m_GlobalSegments,(ulong)rSegments._4_4_);
        if (pvVar7->m_SubjectID == UVar1) {
          for (rSegment._4_4_ = 0;
              sVar6 = std::
                      vector<ViconCGStreamDetail::VGlobalSegments_Segment,_std::allocator<ViconCGStreamDetail::VGlobalSegments_Segment>_>
                      ::size(&pvVar7->m_Segments), rSegment._4_4_ < sVar6;
              rSegment._4_4_ = rSegment._4_4_ + 1) {
            pvVar8 = std::
                     vector<ViconCGStreamDetail::VGlobalSegments_Segment,_std::allocator<ViconCGStreamDetail::VGlobalSegments_Segment>_>
                     ::operator[](&pvVar7->m_Segments,(ulong)rSegment._4_4_);
            if (pvVar8->m_SegmentID == UVar2) {
              __result = std::array<double,_9UL>::begin
                                   ((array<double,_9UL> *)(WorldTranslation._M_elems + 2));
              std::copy<double_const*,double*>(pvVar8->m_Rotation,(double *)(pvVar8 + 1),__result);
              pvVar9 = std::array<double,_3UL>::begin
                                 ((array<double,_3UL> *)(EyeTranslation._M_elems + 2));
              std::copy<double_const*,double*>(pvVar8->m_Translation,pvVar8->m_Rotation,pvVar9);
              pvVar9 = std::array<double,_3UL>::begin
                                 ((array<double,_3UL> *)(WorldEyeTranslation._M_elems + 2));
              std::copy<float_const*,double*>
                        (pvVar5->m_LocalTranslation,pvVar5->m_LocalRotation,pvVar9);
              ClientUtils::operator*
                        (&local_140,(array<double,_9UL> *)(WorldTranslation._M_elems + 2),
                         (array<double,_3UL> *)(WorldEyeTranslation._M_elems + 2));
              ClientUtils::operator+
                        ((array<double,_3UL> *)local_128,&local_140,
                         (array<double,_3UL> *)(EyeTranslation._M_elems + 2));
              i_Translation = std::array<double,_3UL>::data((array<double,_3UL> *)local_128);
              CopyAndTransformT(this,i_Translation,o_rThreeVector);
              this_local._4_4_ = Success;
              goto LAB_0013acdc;
            }
          }
        }
      }
      *(undefined1 *)Lock._8_8_ = 1;
      this_local._4_4_ = Success;
    }
  }
  else {
    this_local._4_4_ = local_44;
  }
LAB_0013acdc:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetEyeTrackerGlobalPosition( const unsigned int i_EyeTrackerID, double (&o_rThreeVector)[3], bool& o_rbOccludedFlag ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rThreeVector, o_rbOccludedFlag ) )
  {
    return GetResult; 
  }

  size_t EyeTrackerIndex = -1;

  for( size_t i = 0; i < m_LatestFrame.m_EyeTrackers.size(); i++ )
  {
    if( m_LatestFrame.m_EyeTrackers[ i ].m_DeviceID == i_EyeTrackerID )
    {
      EyeTrackerIndex = i;
    }
  }

  if( EyeTrackerIndex == BadIndex )
  {
    return Result::InvalidIndex;
  }

  const ViconCGStream::VEyeTrackerInfo & rEyeTracker = m_LatestFrame.m_EyeTrackers[ EyeTrackerIndex ];

  // Look up the ids for the subject and segment
  unsigned int SubjectID = rEyeTracker.m_SubjectID;
  unsigned int SegmentID = rEyeTracker.m_SegmentID;

  // go through the frame's segment data and find its position in this frame
  for( unsigned int i = 0; i < m_LatestFrame.m_GlobalSegments.size(); i++ )
  {
    const ViconCGStream::VGlobalSegments& rSegments = m_LatestFrame.m_GlobalSegments[i];
    if( rSegments.m_SubjectID == SubjectID )
    {
      // now look through its segments
      for( unsigned int j = 0; j < rSegments.m_Segments.size(); j++ )
      {
        const ViconCGStreamDetail::VGlobalSegments_Segment& rSegment = rSegments.m_Segments[j];
        if( rSegment.m_SegmentID == SegmentID )
        {
          // Use the segment to calculate global eye location.

          std::array< double, 3 * 3 > WorldRotation;
          std::copy( rSegment.m_Rotation, rSegment.m_Rotation + 9, WorldRotation.begin() );

          std::array< double, 3 > WorldTranslation;
          std::copy( rSegment.m_Translation, rSegment.m_Translation + 3, WorldTranslation.begin() );

          std::array< double, 3 > EyeTranslation;
          std::copy( rEyeTracker.m_LocalTranslation, rEyeTracker.m_LocalTranslation + 3, EyeTranslation.begin() );

          const std::array< double, 3 > WorldEyeTranslation = WorldRotation * EyeTranslation + WorldTranslation;

          CopyAndTransformT( WorldEyeTranslation.data(), o_rThreeVector );
          return Result::Success;
        }       
      }
    }
  }

  // If we fail to find the segment it is probably just failed to fit.
  // We mark this as an occluded success.

  o_rbOccludedFlag = true;
  return Result::Success;
}